

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall GdlPass::DebugRulePrecedence(GdlPass *this,GrcManager *pcman,ostream *strmOut)

{
  int iVar1;
  int iVar2;
  pointer ppGVar3;
  pointer ppGVar4;
  GdlRule *this_00;
  pointer __last;
  int iVar5;
  ostream *poVar6;
  pointer piVar7;
  pointer piVar8;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
  local_60;
  vector<int,_std::allocator<int>_> viruleSorted;
  
  ppGVar3 = (this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppGVar4 = (this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  poVar6 = std::operator<<(strmOut,"\nPASS: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->m_nGlobalID + this->m_nPreBidiPass + 1);
  if (ppGVar3 == ppGVar4) {
    std::operator<<(poVar6," - no rules\n");
    return;
  }
  poVar6 = std::operator<<(poVar6," (GDL #");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->m_nNumber);
  std::operator<<(poVar6,")\n");
  std::vector<int,_std::allocator<int>_>::vector
            (&viruleSorted,
             (long)(this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_60);
  __last = viruleSorted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar8 = viruleSorted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = 0;
  for (piVar7 = viruleSorted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar7 != viruleSorted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish; piVar7 = piVar7 + 1) {
    *piVar7 = iVar5;
    iVar5 = iVar5 + 1;
  }
  if (viruleSorted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      viruleSorted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
    ::_Temporary_buffer(&local_60,
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        viruleSorted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (((long)viruleSorted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)viruleSorted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start >> 2) + 1) / 2);
    if (local_60._M_buffer == (int *)0x0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<GdlPass::DebugRulePrecedence(GrcManager*,std::ostream&)::__0>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)piVar8,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_silnrsi[P]grcompiler_compiler_Compiler_cpp:868:61)>
                  )this);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,long,__gnu_cxx::__ops::_Iter_comp_iter<GdlPass::DebugRulePrecedence(GrcManager*,std::ostream&)::__0>>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)piVar8,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last,
                 local_60._M_buffer,local_60._M_len,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_silnrsi[P]grcompiler_compiler_Compiler_cpp:868:61)>
                  )this);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
    ::~_Temporary_buffer(&local_60);
    piVar8 = viruleSorted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  iVar5 = this->m_nGlobalID;
  iVar1 = this->m_nPreBidiPass;
  for (; viruleSorted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start != piVar8;
      viruleSorted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = viruleSorted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + 1) {
    iVar2 = *viruleSorted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    this_00 = (this->m_vprule).super__Vector_base<GdlRule_*,_std::allocator<GdlRule_*>_>._M_impl.
              super__Vector_impl_data._M_start[iVar2];
    poVar6 = std::operator<<(strmOut,"\n");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6," - RULE ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5 + iVar1 + 1);
    poVar6 = std::operator<<(poVar6,".");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
    std::operator<<(poVar6,", ");
    GrpLineAndFile::WriteToStream((GrpLineAndFile *)this_00,strmOut,true);
    std::operator<<(strmOut,":  ");
    GdlRule::RulePrettyPrint(this_00,pcman,strmOut,false);
    std::operator<<(strmOut,"\n\n");
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&viruleSorted.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void GdlPass::DebugRulePrecedence(GrcManager * pcman, std::ostream & strmOut)
{
	if (m_vprule.size() == 0)
	{
		strmOut << "\nPASS: " << PassDebuggerNumber() << " - no rules\n";
		return;
	}

	Assert(PassDebuggerNumber() != 0);

	strmOut << "\nPASS: " << PassDebuggerNumber() << " (GDL #" << this->m_nNumber << ")\n";

	// Stable sort rules by their precedence: by the number of items matched (largest first).
	std::vector<int> viruleSorted(m_vprule.size());
	std::iota(viruleSorted.begin(), viruleSorted.end(), 0);
	std::stable_sort(viruleSorted.begin(), viruleSorted.end(), [&](auto const a, auto const b){
		return m_vprule[a]->SortKey() > m_vprule[b]->SortKey();
	});

	auto const nPassNum = PassDebuggerNumber();
	auto seq = 0u;
	for (auto const irule: viruleSorted) 
	{
		auto & rule = *m_vprule[irule];
		strmOut << "\n" << seq++ << " - RULE " << nPassNum << "." << irule << ", ";
		rule.LineAndFile().WriteToStream(strmOut, true);
		strmOut << ":  ";

		rule.RulePrettyPrint(pcman, strmOut, false);
		strmOut << "\n\n";
	}
}